

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNodeListImpl.cpp
# Opt level: O2

DOMNode * __thiscall xercesc_4_0::DOMNodeListImpl::item(DOMNodeListImpl *this,XMLSize_t index)

{
  DOMNode **ppDVar1;
  DOMChildNode *pDVar2;
  DOMNode *p;
  XMLSize_t i;
  ulong uVar3;
  
  if (this->fNode == (DOMParentNode *)0x0) {
    p = (DOMNode *)0x0;
  }
  else {
    uVar3 = 0;
    ppDVar1 = &this->fNode->fFirstChild;
    while ((p = *ppDVar1, uVar3 < index && (p != (DOMNode *)0x0))) {
      pDVar2 = castToChildImpl(p);
      uVar3 = uVar3 + 1;
      ppDVar1 = &pDVar2->nextSibling;
    }
  }
  return p;
}

Assistant:

DOMNode *DOMNodeListImpl::item(XMLSize_t index) const{
    if (fNode) {
        DOMNode *node = fNode->fFirstChild;
        for(XMLSize_t i=0; i<index && node!=0; ++i)
            node = castToChildImpl(node)->nextSibling;
        return node;
    }
    return 0;
}